

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int time_isxmasday(void)

{
  tm *ptVar1;
  long in_FS_OFFSET;
  tm *time_info;
  time_t time_data;
  int local_14;
  time_t local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  time(&local_10);
  ptVar1 = localtime(&local_10);
  if (((ptVar1->tm_mon == 0xb) && (0x17 < ptVar1->tm_mday)) && (ptVar1->tm_mday < 0x1b)) {
    local_14 = 1;
  }
  else {
    local_14 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_14;
  }
  __stack_chk_fail();
}

Assistant:

int time_isxmasday()
{
	time_t time_data;
	struct tm *time_info;

	time(&time_data);
	time_info = localtime(&time_data);
	if(time_info->tm_mon == 11 && time_info->tm_mday >= 24 && time_info->tm_mday <= 26)
		return 1;
	return 0;
}